

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_pipe_send_start(ipc_pipe *p)

{
  nni_aio *pnVar1;
  nni_msg *m;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  uint64_t len;
  nni_iov iov [3];
  int nio;
  nni_msg *msg;
  nni_aio *aio;
  ipc_pipe *p_local;
  
  if ((p->closed & 1U) == 0) {
    pnVar1 = (nni_aio *)nni_list_first(&p->send_q);
    if (pnVar1 != (nni_aio *)0x0) {
      m = nni_aio_get_msg(pnVar1);
      sVar2 = nni_msg_len(m);
      sVar3 = nni_msg_header_len(m);
      lVar4 = sVar2 + sVar3;
      p->tx_head[0] = '\x01';
      p->tx_head[1] = (uint8_t)((ulong)lVar4 >> 0x38);
      p->tx_head[2] = (uint8_t)((ulong)lVar4 >> 0x30);
      p->tx_head[3] = (uint8_t)((ulong)lVar4 >> 0x28);
      p->tx_head[4] = (uint8_t)((ulong)lVar4 >> 0x20);
      p->tx_head[5] = (uint8_t)((ulong)lVar4 >> 0x18);
      p->tx_head[6] = (uint8_t)((ulong)lVar4 >> 0x10);
      p->tx_head[7] = (uint8_t)((ulong)lVar4 >> 8);
      p->tx_head[8] = (uint8_t)lVar4;
      len = (uint64_t)p->tx_head;
      iov[0].iov_buf = (void *)0x9;
      iov[2].iov_len._4_4_ = 1;
      sVar2 = nni_msg_header_len(m);
      if (sVar2 != 0) {
        pvVar5 = nni_msg_header(m);
        iov[(long)(int)iov[2].iov_len._4_4_ + -1].iov_len = (size_t)pvVar5;
        pvVar5 = (void *)nni_msg_header_len(m);
        iov[(int)iov[2].iov_len._4_4_].iov_buf = pvVar5;
        iov[2].iov_len._4_4_ = iov[2].iov_len._4_4_ + 1;
      }
      sVar2 = nni_msg_len(m);
      if (sVar2 != 0) {
        pvVar5 = nni_msg_body(m);
        iov[(long)(int)iov[2].iov_len._4_4_ + -1].iov_len = (size_t)pvVar5;
        pvVar5 = (void *)nni_msg_len(m);
        iov[(int)iov[2].iov_len._4_4_].iov_buf = pvVar5;
        iov[2].iov_len._4_4_ = iov[2].iov_len._4_4_ + 1;
      }
      nni_aio_set_iov(&p->tx_aio,iov[2].iov_len._4_4_,(nni_iov *)&len);
      nng_stream_send(p->conn,&p->tx_aio);
    }
  }
  else {
    while (pnVar1 = (nni_aio *)nni_list_first(&p->send_q), pnVar1 != (nni_aio *)0x0) {
      nni_list_remove(&p->send_q,pnVar1);
      nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    }
  }
  return;
}

Assistant:

static void
ipc_pipe_send_start(ipc_pipe *p)
{
	nni_aio *aio;
	nni_msg *msg;
	int      nio;
	nni_iov  iov[3];
	uint64_t len;

	if (p->closed) {
		while ((aio = nni_list_first(&p->send_q)) != NULL) {
			nni_list_remove(&p->send_q, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}
	if ((aio = nni_list_first(&p->send_q)) == NULL) {
		return;
	}

	// This runs to send the message.
	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg) + nni_msg_header_len(msg);

	p->tx_head[0] = 1; // message type, 1.
	NNI_PUT64(p->tx_head + 1, len);

	nio            = 0;
	iov[0].iov_buf = p->tx_head;
	iov[0].iov_len = sizeof(p->tx_head);
	nio++;
	if (nni_msg_header_len(msg) > 0) {
		iov[nio].iov_buf = nni_msg_header(msg);
		iov[nio].iov_len = nni_msg_header_len(msg);
		nio++;
	}
	if (nni_msg_len(msg) > 0) {
		iov[nio].iov_buf = nni_msg_body(msg);
		iov[nio].iov_len = nni_msg_len(msg);
		nio++;
	}
	nni_aio_set_iov(&p->tx_aio, nio, iov);
	nng_stream_send(p->conn, &p->tx_aio);
}